

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<BT_QUANTIZED_BVH_NODE>::copy
          (btAlignedObjectArray<BT_QUANTIZED_BVH_NODE> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  long in_RCX;
  undefined8 *puVar2;
  int i;
  BT_QUANTIZED_BVH_NODE *dest_local;
  int end_local;
  int start_local;
  btAlignedObjectArray<BT_QUANTIZED_BVH_NODE> *this_local;
  
  for (i = (int)dst; i < (int)src; i = i + 1) {
    puVar1 = (undefined8 *)(in_RCX + (long)i * 0x10);
    puVar2 = (undefined8 *)(*(long *)(this + 0x10) + (long)i * 0x10);
    *puVar1 = *puVar2;
    puVar1[1] = puVar2[1];
  }
  return i;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}